

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O1

void __thiscall trieste::detail::Make::add(Make *this,Token *type,size_t index)

{
  size_type *psVar1;
  NodeDef *this_00;
  Location *pLVar2;
  undefined1 auStack_58 [24];
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  size_t sStack_30;
  Token local_28;
  
  if ((type->def != (TokenDef *)Group) &&
     ((((this->node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_
      ).def != (TokenDef *)Group)) {
    local_28.def = (TokenDef *)Group;
    push(this,&local_28,0);
  }
  this_00 = (this->node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pLVar2 = REMatch::at(&this->re_match,index);
  auStack_58._16_8_ =
       (pLVar2->source).super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40 = (element_type *)
             (pLVar2->source).super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  if (local_40 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      psVar1 = &(local_40->origin_)._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
      UNLOCK();
    }
    else {
      psVar1 = &(local_40->origin_)._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
    }
  }
  local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLVar2->pos;
  sStack_30 = pLVar2->len;
  NodeDef::create((NodeDef *)auStack_58,type,(Location *)(auStack_58 + 0x10));
  NodeDef::push_back(this_00,(Node *)auStack_58);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_58._8_8_);
  }
  if (local_40 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40);
  }
  return;
}

Assistant:

void add(const Token& type, size_t index = 0)
      {
        if ((type != Group) && !in(Group))
          push(Group);

        node->push_back(NodeDef::create(type, re_match.at(index)));
      }